

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteExprList(BinaryWriter *this,Func *func,ExprList *exprs)

{
  Expr *pEVar1;
  Expr *pEVar2;
  bool bVar3;
  Index IVar4;
  Address AVar5;
  uint32_t uVar6;
  RelocType reloc_type;
  ulong uVar7;
  size_t size;
  ExprList *exprs_00;
  char *pcVar8;
  Opcode OVar9;
  Stream *pSVar10;
  TryExpr *try_expr;
  Var *var;
  Expr *pEVar11;
  _func_int **local_48;
  Expr *pEStack_40;
  
  pEVar1 = exprs->first_;
  do {
    if (pEVar1 == (Expr *)0x0) {
      return;
    }
    switch(pEVar1->type_) {
    case AtomicLoad:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar5 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,*(Address *)&pEVar1[1]._vptr_Expr);
      uVar6 = 0;
      if (1 < AVar5) {
        uVar6 = 0;
        uVar7 = (ulong)AVar5;
        do {
          uVar7 = uVar7 >> 1;
          uVar6 = uVar6 + 1;
          bVar3 = 3 < AVar5;
          AVar5 = (uint)uVar7;
        } while (bVar3);
      }
      goto LAB_00f40e2e;
    case AtomicRmw:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar5 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,*(Address *)&pEVar1[1]._vptr_Expr);
      uVar6 = 0;
      if (1 < AVar5) {
        uVar6 = 0;
        uVar7 = (ulong)AVar5;
        do {
          uVar7 = uVar7 >> 1;
          uVar6 = uVar6 + 1;
          bVar3 = 3 < AVar5;
          AVar5 = (uint)uVar7;
        } while (bVar3);
      }
      goto LAB_00f40e2e;
    case AtomicRmwCmpxchg:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar5 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,*(Address *)&pEVar1[1]._vptr_Expr);
      uVar6 = 0;
      if (1 < AVar5) {
        uVar6 = 0;
        uVar7 = (ulong)AVar5;
        do {
          uVar7 = uVar7 >> 1;
          uVar6 = uVar6 + 1;
          bVar3 = 3 < AVar5;
          AVar5 = (uint)uVar7;
        } while (bVar3);
      }
      goto LAB_00f40e2e;
    case AtomicStore:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar5 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,*(Address *)&pEVar1[1]._vptr_Expr);
      uVar6 = 0;
      if (1 < AVar5) {
        uVar6 = 0;
        uVar7 = (ulong)AVar5;
        do {
          uVar7 = uVar7 >> 1;
          uVar6 = uVar6 + 1;
          bVar3 = 3 < AVar5;
          AVar5 = (uint)uVar7;
        } while (bVar3);
      }
      goto LAB_00f40e2e;
    case AtomicWait:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar5 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,*(Address *)&pEVar1[1]._vptr_Expr);
      uVar6 = 0;
      if (1 < AVar5) {
        uVar6 = 0;
        uVar7 = (ulong)AVar5;
        do {
          uVar7 = uVar7 >> 1;
          uVar6 = uVar6 + 1;
          bVar3 = 3 < AVar5;
          AVar5 = (uint)uVar7;
        } while (bVar3);
      }
      goto LAB_00f40e2e;
    case AtomicWake:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar5 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,*(Address *)&pEVar1[1]._vptr_Expr);
      uVar6 = 0;
      if (1 < AVar5) {
        uVar6 = 0;
        uVar7 = (ulong)AVar5;
        do {
          uVar7 = uVar7 >> 1;
          uVar6 = uVar6 + 1;
          bVar3 = 3 < AVar5;
          AVar5 = (uint)uVar7;
        } while (bVar3);
      }
LAB_00f40e2e:
      Stream::WriteU8(this->stream_,uVar6,"alignment",No);
      pSVar10 = this->stream_;
      uVar6 = *(uint32_t *)((long)&pEVar1[1]._vptr_Expr + 4);
      pcVar8 = "memory offset";
      break;
    case Binary:
    case Compare:
    case Convert:
    case Ternary:
    case Unary:
      pSVar10 = this->stream_;
      OVar9.enum_ = *(Enum *)&pEVar1->field_0x3c;
      goto LAB_00f40f1f;
    case Block:
      WriteOpcode(this->stream_,(Opcode)0x2);
      if ((pEVar1->type_ != Block) ||
         (WriteBlockDecl(this,(BlockDeclaration *)&pEVar1[1].loc.filename.size_),
         pEVar1->type_ != Block)) {
        pcVar8 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
        ;
LAB_00f4132a:
        __assert_fail("isa<Derived>(base)",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/cast.h"
                      ,0x48,pcVar8);
      }
      goto LAB_00f40b88;
    case Br:
      WriteOpcode(this->stream_,(Opcode)0xc);
      if (pEVar1->type_ != Br) {
        pcVar8 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::Br>, Base = wabt::Expr]"
        ;
        goto LAB_00f4132a;
      }
      goto LAB_00f40dcc;
    case BrIf:
      WriteOpcode(this->stream_,(Opcode)0xd);
      if (pEVar1->type_ != BrIf) {
        pcVar8 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::BrIf>, Base = wabt::Expr]"
        ;
        goto LAB_00f4132a;
      }
LAB_00f40dcc:
      if ((int)pEVar1[1].loc.filename.size_ != 0) {
LAB_00f41269:
        __assert_fail("is_index()",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/ir.h"
                      ,0x36,"Index wabt::Var::index() const");
      }
      pSVar10 = this->stream_;
      uVar6 = pEVar1[1].loc.field_1.field_0.line;
      pcVar8 = "break depth";
      break;
    case BrTable:
      WriteOpcode(this->stream_,(Opcode)0xe);
      WriteU32Leb128(this->stream_,
                     (int)((ulong)((long)pEVar1[1].super_intrusive_list_base<wabt::Expr>.next_ -
                                  (long)pEVar1[1]._vptr_Expr) >> 3) * 0x38e38e39,"num targets");
      pEVar2 = pEVar1[1].super_intrusive_list_base<wabt::Expr>.next_;
      for (pEVar11 = (Expr *)pEVar1[1]._vptr_Expr; pEVar11 != pEVar2;
          pEVar11 = (Expr *)&pEVar11[1].super_intrusive_list_base<wabt::Expr>) {
        if ((int)(pEVar11->loc).filename.size_ != 0) goto LAB_00f41269;
        WriteU32Leb128(this->stream_,(pEVar11->loc).field_1.field_0.line,"break depth");
      }
      if (pEVar1[1].type_ != AtomicLoad) goto LAB_00f41269;
      WriteU32Leb128(this->stream_,*(uint32_t *)&pEVar1[2]._vptr_Expr,"break depth for default");
      goto switchD_00f40857_default;
    case Call:
      IVar4 = Module::GetFuncIndex(this->module_,(Var *)(pEVar1 + 1));
      pSVar10 = this->stream_;
      OVar9.enum_ = Call;
      goto LAB_00f40bb4;
    case CallIndirect:
      IVar4 = Module::GetFuncTypeIndex(this->module_,(FuncDeclaration *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0x11);
      WriteU32Leb128WithReloc(this,IVar4,"signature index",TypeIndexLEB);
      pSVar10 = this->stream_;
      pcVar8 = "call_indirect reserved";
      goto LAB_00f41047;
    case Const:
      switch((int)pEVar1[1].loc.filename.size_) {
      case -5:
        WriteOpcode(this->stream_,(Opcode)0xce);
        pSVar10 = this->stream_;
        local_48 = (_func_int **)pEVar1[1].loc.field_1.field_1.offset;
        pEStack_40 = *(Expr **)((long)&pEVar1[1].loc.field_1 + 8);
        pcVar8 = "v128 literal";
        goto LAB_00f40acc;
      case -4:
        WriteOpcode(this->stream_,(Opcode)0x37);
        pSVar10 = this->stream_;
        local_48 = (_func_int **)pEVar1[1].loc.field_1.field_1.offset;
        pcVar8 = "f64 literal";
        size = 8;
        goto LAB_00f40ad1;
      case -3:
        WriteOpcode(this->stream_,(Opcode)0x36);
        pSVar10 = this->stream_;
        local_48 = (_func_int **)CONCAT44(local_48._4_4_,pEVar1[1].loc.field_1.field_0.line);
        pcVar8 = "f32 literal";
        size = 4;
LAB_00f40ad1:
        Stream::WriteData(pSVar10,&local_48,size,pcVar8,No);
        break;
      case -2:
        WriteOpcode(this->stream_,(Opcode)0x35);
        WriteS64Leb128(this->stream_,pEVar1[1].loc.field_1.field_1.offset,"i64 literal");
        break;
      case -1:
        WriteOpcode(this->stream_,(Opcode)0x34);
        WriteS32Leb128(this->stream_,pEVar1[1].loc.field_1.field_0.line,"i32 literal");
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-writer.cc"
                      ,0x1eb,
                      "void wabt::(anonymous namespace)::BinaryWriter::WriteExpr(const Func *, const Expr *)"
                     );
      }
      goto switchD_00f40857_default;
    case Drop:
      pSVar10 = this->stream_;
      OVar9.enum_ = Drop;
      goto LAB_00f40f1f;
    case GetGlobal:
      IVar4 = Module::GetGlobalIndex(this->module_,(Var *)(pEVar1 + 1));
      pSVar10 = this->stream_;
      OVar9.enum_ = GetGlobal;
      goto LAB_00f40f77;
    case GetLocal:
      if (func == (Func *)0x0) {
        uVar6 = 0xffffffff;
        if ((int)pEVar1[1].loc.filename.size_ == 0) {
          uVar6 = pEVar1[1].loc.field_1.field_0.line;
        }
      }
      else {
        uVar6 = Func::GetLocalIndex(func,(Var *)(pEVar1 + 1));
      }
      pSVar10 = this->stream_;
      OVar9.enum_ = GetLocal;
      goto LAB_00f4118e;
    case If:
      WriteOpcode(this->stream_,(Opcode)0x4);
      WriteBlockDecl(this,(BlockDeclaration *)&pEVar1[1].loc.filename.size_);
      goto LAB_00f40ed6;
    case IfExcept:
      WriteOpcode(this->stream_,(Opcode)0xa);
      WriteBlockDecl(this,(BlockDeclaration *)&pEVar1[1].loc.filename.size_);
      IVar4 = Module::GetExceptIndex
                        (this->module_,(Var *)&pEVar1[5].super_intrusive_list_base<wabt::Expr>.prev_
                        );
      WriteU32Leb128(this->stream_,IVar4,"exception index");
LAB_00f40ed6:
      WriteExprList(this,func,(ExprList *)&pEVar1[3].loc.filename.size_);
      if (pEVar1[4].loc.field_1.field_1.offset != 0) {
        exprs_00 = (ExprList *)&pEVar1[4].loc;
        WriteOpcode(this->stream_,(Opcode)0x5);
        goto LAB_00f40f12;
      }
      goto LAB_00f40f17;
    case Load:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar5 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,*(Address *)&pEVar1[1]._vptr_Expr);
      uVar6 = 0;
      if (1 < AVar5) {
        uVar6 = 0;
        uVar7 = (ulong)AVar5;
        do {
          uVar7 = uVar7 >> 1;
          uVar6 = uVar6 + 1;
          bVar3 = 3 < AVar5;
          AVar5 = (uint)uVar7;
        } while (bVar3);
      }
      Stream::WriteU8(this->stream_,uVar6,"alignment",No);
      pSVar10 = this->stream_;
      uVar6 = *(uint32_t *)((long)&pEVar1[1]._vptr_Expr + 4);
      pcVar8 = "load offset";
      break;
    case Loop:
      WriteOpcode(this->stream_,(Opcode)0x3);
      if ((pEVar1->type_ != Loop) ||
         (WriteBlockDecl(this,(BlockDeclaration *)&pEVar1[1].loc.filename.size_),
         pEVar1->type_ != Loop)) {
        pcVar8 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
        ;
        goto LAB_00f4132a;
      }
LAB_00f40b88:
      exprs_00 = (ExprList *)&pEVar1[3].loc.filename.size_;
LAB_00f40f12:
      WriteExprList(this,func,exprs_00);
LAB_00f40f17:
      pSVar10 = this->stream_;
      OVar9.enum_ = End;
      goto LAB_00f40f1f;
    case MemoryCopy:
      WriteOpcode(this->stream_,(Opcode)0xc7);
      pSVar10 = this->stream_;
      pcVar8 = "memory.copy reserved";
      goto LAB_00f41047;
    case MemoryDrop:
      uVar6 = Module::GetDataSegmentIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xc6);
      pSVar10 = this->stream_;
      pcVar8 = "memory.drop segment";
      break;
    case MemoryFill:
      WriteOpcode(this->stream_,(Opcode)0xc8);
      pSVar10 = this->stream_;
      pcVar8 = "memory.fill reserved";
      goto LAB_00f41047;
    case MemoryGrow:
      WriteOpcode(this->stream_,(Opcode)0x33);
      pSVar10 = this->stream_;
      pcVar8 = "memory.grow reserved";
      goto LAB_00f41047;
    case MemoryInit:
      uVar6 = Module::GetDataSegmentIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xc5);
      WriteU32Leb128(this->stream_,0,"memory.init reserved");
      pSVar10 = this->stream_;
      pcVar8 = "memory.init segment";
      break;
    case MemorySize:
      WriteOpcode(this->stream_,(Opcode)0x32);
      pSVar10 = this->stream_;
      pcVar8 = "memory.size reserved";
      goto LAB_00f41047;
    case Nop:
      pSVar10 = this->stream_;
      OVar9.enum_ = Nop;
      goto LAB_00f40f1f;
    case Rethrow:
      pSVar10 = this->stream_;
      OVar9.enum_ = Rethrow;
      goto LAB_00f40f1f;
    case Return:
      pSVar10 = this->stream_;
      OVar9.enum_ = Return;
      goto LAB_00f40f1f;
    case ReturnCall:
      IVar4 = Module::GetFuncIndex(this->module_,(Var *)(pEVar1 + 1));
      pSVar10 = this->stream_;
      OVar9.enum_ = ReturnCall;
LAB_00f40bb4:
      WriteOpcode(pSVar10,OVar9);
      pcVar8 = "block type function index";
      reloc_type = First;
LAB_00f40f8e:
      WriteU32Leb128WithReloc(this,IVar4,pcVar8 + 0xb,reloc_type);
      goto switchD_00f40857_default;
    case ReturnCallIndirect:
      IVar4 = Module::GetFuncTypeIndex(this->module_,(FuncDeclaration *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0x13);
      WriteU32Leb128WithReloc(this,IVar4,"signature index",TypeIndexLEB);
      pSVar10 = this->stream_;
      pcVar8 = "return_call_indirect reserved";
      goto LAB_00f41047;
    case Select:
      pSVar10 = this->stream_;
      OVar9.enum_ = Select;
      goto LAB_00f40f1f;
    case SetGlobal:
      IVar4 = Module::GetGlobalIndex(this->module_,(Var *)(pEVar1 + 1));
      pSVar10 = this->stream_;
      OVar9.enum_ = SetGlobal;
LAB_00f40f77:
      WriteOpcode(pSVar10,OVar9);
      pcVar8 = "get_global global index";
      reloc_type = GlobalIndexLEB;
      goto LAB_00f40f8e;
    case SetLocal:
      if (func == (Func *)0x0) {
        uVar6 = 0xffffffff;
        if ((int)pEVar1[1].loc.filename.size_ == 0) {
          uVar6 = pEVar1[1].loc.field_1.field_0.line;
        }
      }
      else {
        uVar6 = Func::GetLocalIndex(func,(Var *)(pEVar1 + 1));
      }
      pSVar10 = this->stream_;
      OVar9.enum_ = SetLocal;
      goto LAB_00f4118e;
    case SimdLaneOp:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      if (pEVar1->type_ != SimdLaneOp) {
        pcVar8 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::SimdLaneOpExpr, Base = wabt::Expr]"
        ;
        goto LAB_00f4132a;
      }
      Stream::WriteU8(this->stream_,(uint)*(byte *)&pEVar1[1]._vptr_Expr,"Simd Lane literal",No);
      goto switchD_00f40857_default;
    case SimdShuffleOp:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      if (pEVar1->type_ != SimdShuffleOp) {
        pcVar8 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::SimdShuffleOpExpr, Base = wabt::Expr]"
        ;
        goto LAB_00f4132a;
      }
      pSVar10 = this->stream_;
      local_48 = pEVar1[1]._vptr_Expr;
      pEStack_40 = pEVar1[1].super_intrusive_list_base<wabt::Expr>.next_;
      pcVar8 = "Simd Lane[16] literal";
LAB_00f40acc:
      size = 0x10;
      goto LAB_00f40ad1;
    case Store:
      WriteOpcode(this->stream_,(Opcode)*(Enum *)&pEVar1->field_0x3c);
      AVar5 = Opcode::GetAlignment((Opcode *)&pEVar1->field_0x3c,*(Address *)&pEVar1[1]._vptr_Expr);
      uVar6 = 0;
      if (1 < AVar5) {
        uVar6 = 0;
        uVar7 = (ulong)AVar5;
        do {
          uVar7 = uVar7 >> 1;
          uVar6 = uVar6 + 1;
          bVar3 = 3 < AVar5;
          AVar5 = (uint)uVar7;
        } while (bVar3);
      }
      Stream::WriteU8(this->stream_,uVar6,"alignment",No);
      pSVar10 = this->stream_;
      uVar6 = *(uint32_t *)((long)&pEVar1[1]._vptr_Expr + 4);
      pcVar8 = "store offset";
      break;
    case TableInit:
      uVar6 = Module::GetElemSegmentIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xc9);
      WriteU32Leb128(this->stream_,0,"table.init reserved");
      pSVar10 = this->stream_;
      pcVar8 = "table.init segment";
      break;
    case TableCopy:
      WriteOpcode(this->stream_,(Opcode)0xcb);
      pSVar10 = this->stream_;
      pcVar8 = "table.copy reserved";
LAB_00f41047:
      uVar6 = 0;
      break;
    case TableDrop:
      uVar6 = Module::GetElemSegmentIndex(this->module_,(Var *)(pEVar1 + 1));
      WriteOpcode(this->stream_,(Opcode)0xca);
      pSVar10 = this->stream_;
      pcVar8 = "table.drop segment";
      break;
    case TeeLocal:
      if (func == (Func *)0x0) {
        uVar6 = 0xffffffff;
        if ((int)pEVar1[1].loc.filename.size_ == 0) {
          uVar6 = pEVar1[1].loc.field_1.field_0.line;
        }
      }
      else {
        uVar6 = Func::GetLocalIndex(func,(Var *)(pEVar1 + 1));
      }
      pSVar10 = this->stream_;
      OVar9.enum_ = TeeLocal;
LAB_00f4118e:
      WriteOpcode(pSVar10,OVar9);
      pSVar10 = this->stream_;
      pcVar8 = "local index";
      break;
    case Throw:
      WriteOpcode(this->stream_,(Opcode)0x8);
      if (pEVar1->type_ != Throw) {
        pcVar8 = 
        "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::Throw>, Base = wabt::Expr]"
        ;
        goto LAB_00f4132a;
      }
      if ((int)pEVar1[1].loc.filename.size_ != 0) goto LAB_00f41269;
      pSVar10 = this->stream_;
      uVar6 = pEVar1[1].loc.field_1.field_0.line;
      pcVar8 = "throw exception";
      break;
    case Try:
      WriteOpcode(this->stream_,(Opcode)0x6);
      WriteBlockDecl(this,(BlockDeclaration *)&pEVar1[1].loc.filename.size_);
      WriteExprList(this,func,(ExprList *)&pEVar1[3].loc.filename.size_);
      WriteOpcode(this->stream_,(Opcode)0x7);
      exprs_00 = (ExprList *)&pEVar1[4].loc;
      goto LAB_00f40f12;
    case Last:
      pSVar10 = this->stream_;
      OVar9.enum_ = Unreachable;
LAB_00f40f1f:
      WriteOpcode(pSVar10,OVar9);
    default:
      goto switchD_00f40857_default;
    }
    WriteU32Leb128(pSVar10,uVar6,pcVar8);
switchD_00f40857_default:
    pEVar1 = (pEVar1->super_intrusive_list_base<wabt::Expr>).next_;
  } while( true );
}

Assistant:

void BinaryWriter::WriteExprList(const Func* func, const ExprList& exprs) {
  for (const Expr& expr : exprs) {
    WriteExpr(func, &expr);
  }
}